

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles3::Functional::eval_length_vec3(ShaderEvalContext *c)

{
  Type_conflict TVar1;
  Vector<float,_3> local_14;
  
  local_14.m_data[0] = c->in[0].m_data[2];
  local_14.m_data._4_8_ = *(undefined8 *)c->in[0].m_data;
  TVar1 = tcu::length<float,3>(&local_14);
  (c->color).m_data[0] = TVar1;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }